

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O2

void find_path(PATHFIND_DATA *path,ROOM_INDEX_DATA *goal)

{
  ROOM_INDEX_DATA *pRVar1;
  CHAR_DATA *pCVar2;
  char *pcVar3;
  EXIT_DATA *pEVar4;
  int i;
  PATHFIND_DATA *pPVar5;
  ROOM_INDEX_DATA *pRVar6;
  long lVar7;
  bool bVar8;
  
  path->evaluated = true;
  iterations = iterations + 1;
  pRVar6 = path->room;
  if (pRVar6 == goal) {
    if ((best_path == (PATHFIND_DATA *)0x0) || (path->steps < best_path->steps)) {
      best_path = path;
    }
  }
  else {
    bVar8 = false;
    for (lVar7 = 7; lVar7 != 0xd; lVar7 = lVar7 + 1) {
      if ((best_path == (PATHFIND_DATA *)0x0) || (1 < best_path->steps)) {
        if ((pRVar6->exit[lVar7 + -7] != (EXIT_DATA *)0x0) &&
           ((pRVar1 = (pRVar6->exit[lVar7 + -7]->u1).to_room, pRVar1 != (ROOM_INDEX_DATA *)0x0 &&
            (pRVar1->area == goal->area)))) {
          pPVar5 = pRVar1->path;
          if (pPVar5 != (PATHFIND_DATA *)0x0) {
            if (((pPVar5->steps <= path->steps + 1) && (pPVar5->evaluated != false)) ||
               ((pPVar5->steps <= path->steps && (pPVar5->evaluated != true)))) goto LAB_002b7d61;
          }
          goto LAB_002b7d41;
        }
      }
      else {
LAB_002b7d41:
        bVar8 = true;
      }
LAB_002b7d61:
    }
    if (bVar8) {
      for (lVar7 = -6; lVar7 != 0; lVar7 = lVar7 + 1) {
        if (((pRVar6->tracks[lVar7] != (TRACK_DATA *)0x0) &&
            (pCVar2 = pRVar6->tracks[lVar7]->prey, pCVar2 != (CHAR_DATA *)0x0)) &&
           (pCVar2->pet == (CHAR_DATA *)goal->area)) {
          pcVar3 = pCVar2->short_descr;
          if (pcVar3 != (char *)0x0) {
            if (((*(int *)(pcVar3 + 0x10) <= path->steps + 1) && (pcVar3[8] != '\0')) ||
               ((*(int *)(pcVar3 + 0x10) <= path->steps && (pcVar3[8] != '\x01'))))
            goto LAB_002b7e2f;
          }
          pPVar5 = new_path_data();
          pPVar5->room = (ROOM_INDEX_DATA *)path->room->tracks[lVar7]->prey;
          pPVar5->dir_from = (int)lVar7 + 6;
          pPVar5->steps = path->steps + 1;
          pPVar5->prev = path;
          path[1].dir_to[lVar7 + -4] = pPVar5;
          pRVar6 = path->room;
          pRVar6->tracks[lVar7]->prey->short_descr = (char *)pPVar5;
        }
LAB_002b7e2f:
      }
      for (lVar7 = 7; lVar7 != 0xd; lVar7 = lVar7 + 1) {
        pEVar4 = path->room->exit[lVar7 + -7];
        if (((pEVar4 != (EXIT_DATA *)0x0) && (path->dir_to[lVar7 + -7] != (PATHFIND_DATA *)0x0)) &&
           ((pRVar6 = (pEVar4->u1).to_room, pRVar6 != (ROOM_INDEX_DATA *)0x0 &&
            ((pRVar6->area == goal->area && (pRVar6->path->evaluated == false)))))) {
          find_path(path->dir_to[lVar7 + -7],goal);
        }
      }
    }
    else {
      for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
        path->dir_to[lVar7] = (PATHFIND_DATA *)0x0;
      }
    }
  }
  return;
}

Assistant:

void find_path(PATHFIND_DATA *path, ROOM_INDEX_DATA *goal)
{
	path->evaluated = true;
	iterations++;

	if (path->room == goal)
	{
		if (!best_path || best_path->steps > path->steps)
			best_path = path;

		return;
	}

	auto found = false;
	for (auto i = 0; i < 6; i++)
	{
		if ((best_path && best_path->steps < 2)
			|| (path->room->exit[i] 
				&& path->room->exit[i]->u1.to_room
				&& path->room->exit[i]->u1.to_room->area == goal->area
				&& !(path->room->exit[i]->u1.to_room->path
					&& path->room->exit[i]->u1.to_room->path->steps <= path->steps + 1
					&& path->room->exit[i]->u1.to_room->path->evaluated)
				&& !(path->room->exit[i]->u1.to_room->path
					&& path->room->exit[i]->u1.to_room->path->steps < path->steps + 1
					&& !path->room->exit[i]->u1.to_room->path->evaluated)))
		{
			found = true;
		}
	}

	if (!found)
	{
		for (auto i = 0; i < 6; i++)
		{
			path->dir_to[i] = nullptr;
		}

		return;
	}

	for (auto i = 0; i < 6; i++)
	{
		if (!path->room->exit[i]
			|| !path->room->exit[i]->u1.to_room
			|| path->room->exit[i]->u1.to_room->area != goal->area
			|| (path->room->exit[i]->u1.to_room->path 
				&& path->room->exit[i]->u1.to_room->path->steps <= path->steps + 1 
				&& path->room->exit[i]->u1.to_room->path->evaluated)
			|| (path->room->exit[i]->u1.to_room->path
				&& path->room->exit[i]->u1.to_room->path->steps < path->steps + 1
				&& !path->room->exit[i]->u1.to_room->path->evaluated))
		{
			continue;
		}

		auto next_path = new_path_data();
		next_path->room = path->room->exit[i]->u1.to_room;
		next_path->dir_from = i;
		next_path->steps = path->steps + 1;
		next_path->prev = path;

		path->dir_to[i] = next_path;
		path->room->exit[i]->u1.to_room->path = next_path;
	}

	for (auto i = 0; i < 6; i++)
	{
		if (!path->room->exit[i]
			|| !path->dir_to[i]
			|| !path->room->exit[i]->u1.to_room
			|| path->room->exit[i]->u1.to_room->area != goal->area
			|| path->room->exit[i]->u1.to_room->path->evaluated)
		{
			continue;
		}

		find_path(path->dir_to[i], goal);
	}
}